

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  GetterXsYs<unsigned_long_long> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  GetterXsYRef<unsigned_long_long> *pGVar14;
  ImDrawVert *pIVar15;
  uint *puVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ImPlotContext *pIVar21;
  ImPlotContext *pIVar22;
  uint uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar38;
  float fVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  
  pIVar21 = GImPlot;
  pGVar11 = this->Getter1;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  lVar24 = (long)(((pGVar11->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar11->Xs + lVar24);
  auVar30._8_4_ = (int)(uVar1 >> 0x20);
  auVar30._0_8_ = uVar1;
  auVar30._12_4_ = 0x45300000;
  uVar2 = *(unsigned_long_long *)((long)pGVar11->Ys + lVar24);
  auVar31._8_4_ = (int)(uVar2 >> 0x20);
  auVar31._0_8_ = uVar2;
  auVar31._12_4_ = 0x45300000;
  dVar17 = log10(((auVar30._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar13 = pIVar21->CurrentPlot;
  dVar3 = pIVar21->LogDenX;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar18 = log10(((auVar31._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  pIVar22 = GImPlot;
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar21->CurrentPlot;
  pGVar14 = this->Getter2;
  pTVar12 = this->Transformer;
  iVar9 = pGVar14->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar14->Xs +
           (long)(((prim + 1 + pGVar14->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar14->Stride);
  auVar35._0_8_ = (double)CONCAT44(0x43300000,(int)uVar1);
  auVar35._8_4_ = (int)(uVar1 >> 0x20);
  auVar35._12_4_ = 0x45300000;
  dVar6 = pGVar14->YRef;
  auVar36._8_8_ = dVar18;
  auVar36._0_8_ = dVar17;
  auVar19._8_4_ = SUB84(pIVar21->LogDenY[iVar8],0);
  auVar19._0_8_ = dVar3;
  auVar19._12_4_ = (int)((ulong)pIVar21->LogDenY[iVar8] >> 0x20);
  auVar37 = divpd(auVar36,auVar19);
  dVar3 = pIVar13->YAxis[iVar8].Range.Min;
  IVar7 = pIVar21->PixelRange[iVar8].Min;
  fVar25 = (float)(pIVar21->Mx *
                   (((double)(float)auVar37._0_8_ * (dVar5 - dVar4) + dVar4) -
                   (pIVar13->XAxis).Range.Min) + (double)IVar7.x);
  fVar27 = (float)(pIVar21->My[iVar8] *
                   (((double)(float)auVar37._8_8_ * (pIVar13->YAxis[iVar8].Range.Max - dVar3) +
                    dVar3) - dVar3) + (double)IVar7.y);
  dVar17 = log10(((auVar35._8_8_ - 1.9342813113834067e+25) + (auVar35._0_8_ - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar13 = pIVar22->CurrentPlot;
  dVar3 = pIVar22->LogDenX;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar6 = log10(dVar6 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar8 = pTVar12->YAxis;
  auVar32._8_8_ = dVar6;
  auVar32._0_8_ = dVar17;
  auVar37._8_4_ = SUB84(pIVar22->LogDenY[iVar8],0);
  auVar37._0_8_ = dVar3;
  auVar37._12_4_ = (int)((ulong)pIVar22->LogDenY[iVar8] >> 0x20);
  auVar37 = divpd(auVar32,auVar37);
  pIVar13 = pIVar22->CurrentPlot;
  dVar3 = pIVar13->YAxis[iVar8].Range.Min;
  IVar7 = pIVar22->PixelRange[iVar8].Min;
  fVar26 = (float)(pIVar22->Mx *
                   (((double)(float)auVar37._0_8_ * (dVar5 - dVar4) + dVar4) -
                   (pIVar13->XAxis).Range.Min) + (double)IVar7.x);
  fVar28 = (float)(pIVar22->My[iVar8] *
                   (((double)(float)auVar37._8_8_ * (pIVar13->YAxis[iVar8].Range.Max - dVar3) +
                    dVar3) - dVar3) + (double)IVar7.y);
  fVar34 = (this->P12).x;
  fVar38 = (this->P12).y;
  fVar40 = (this->P11).x;
  fVar41 = (this->P11).y;
  fVar29 = fVar27 * fVar40 - fVar25 * fVar41;
  fVar42 = fVar34 * fVar28 - fVar38 * fVar26;
  fVar40 = fVar40 - fVar25;
  fVar34 = fVar34 - fVar26;
  fVar39 = fVar38 - fVar28;
  fVar43 = fVar39 * fVar40 - (fVar41 - fVar27) * fVar34;
  auVar33._0_4_ = fVar29 * fVar34 - fVar42 * fVar40;
  auVar33._4_4_ = fVar29 * fVar39 - fVar42 * (fVar41 - fVar27);
  auVar33._8_4_ = fVar27 * 0.0 - fVar38 * 0.0;
  auVar33._12_4_ = fVar27 * 0.0 - fVar38 * 0.0;
  auVar20._4_4_ = fVar43;
  auVar20._0_4_ = fVar43;
  auVar20._8_4_ = fVar39;
  auVar20._12_4_ = fVar39;
  auVar37 = divps(auVar33,auVar20);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar15 = DrawList->_VtxWritePtr;
  pIVar15->col = this->Col;
  pIVar15[1].pos.x = fVar25;
  pIVar15[1].pos.y = fVar27;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar15 = DrawList->_VtxWritePtr;
  pIVar15[1].col = this->Col;
  pIVar15[2].pos = auVar37._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar15 = DrawList->_VtxWritePtr;
  pIVar15[2].col = this->Col;
  pIVar15[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar15 = DrawList->_VtxWritePtr;
  pIVar15[3].col = this->Col;
  IVar7.y = fVar28;
  IVar7.x = fVar26;
  pIVar15[4].pos = IVar7;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar15 = DrawList->_VtxWritePtr;
  pIVar15[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar15 + 5;
  uVar10 = DrawList->_VtxCurrentIdx;
  puVar16 = DrawList->_IdxWritePtr;
  *puVar16 = uVar10;
  uVar23 = -(uint)(fVar38 < fVar41 && fVar27 < fVar28 || fVar28 < fVar27 && fVar41 < fVar38) & 1;
  puVar16[1] = uVar10 + uVar23 + 1;
  puVar16[2] = DrawList->_VtxCurrentIdx + 3;
  puVar16[3] = DrawList->_VtxCurrentIdx + 1;
  puVar16[4] = (uVar23 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar16[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar16 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar25;
  (this->P11).y = fVar27;
  (this->P12).x = fVar26;
  (this->P12).y = fVar28;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }